

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O1

void __thiscall TPZMatrix<std::complex<double>_>::Simetrize(TPZMatrix<std::complex<double>_> *this)

{
  long lVar1;
  undefined8 uVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar5;
  long lVar6;
  long lVar7;
  
  if ((this->super_TPZBaseMatrix).fRow != (this->super_TPZBaseMatrix).fCol) {
    Error("Simetrize only work for square matrices",(char *)0x0);
  }
  lVar1 = (this->super_TPZBaseMatrix).fRow;
  if (0 < lVar1) {
    lVar5 = 0;
    do {
      lVar6 = lVar5 + 1;
      for (lVar7 = lVar6; lVar7 < lVar1; lVar7 = lVar7 + 1) {
        iVar3 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x22])
                          (this,lVar5,lVar7);
        iVar4 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x22])
                          (this,lVar7,lVar5);
        uVar2 = ((undefined8 *)CONCAT44(extraout_var,iVar3))[1];
        *(undefined8 *)CONCAT44(extraout_var_00,iVar4) = *(undefined8 *)CONCAT44(extraout_var,iVar3)
        ;
        ((undefined8 *)CONCAT44(extraout_var_00,iVar4))[1] = uVar2;
      }
      lVar5 = lVar6;
    } while (lVar6 != lVar1);
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::Simetrize() {
  
  if ( Rows() != Cols() ) {
    Error( "Simetrize only work for square matrices" );
  }
  
  int64_t row,col;
  int64_t fDim1 = Rows();
  for(row=0; row<fDim1; row++) {
    for(col=row+1; col<fDim1; col++) {
      this->s(col,row) = this->s(row,col);
    }
  }
  
}